

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  LodePNGColorType LVar1;
  byte bVar2;
  byte g_00;
  byte bVar3;
  LodePNGColorMode *mode_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  undefined8 in_R11;
  ulong uVar13;
  undefined7 uVar14;
  byte bVar15;
  size_t sVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  byte local_109;
  byte local_108;
  byte local_107;
  byte local_106;
  byte local_105;
  uint local_104;
  uchar *local_100;
  ulong local_f8;
  uint local_ec;
  ulong local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  LodePNGColorMode *local_c8;
  size_t local_c0;
  ColorTree tree;
  
  local_f8 = (ulong)(w * h);
  LVar1 = mode->colortype;
  local_100 = in;
  uVar4 = lodepng_can_have_alpha(mode);
  uVar5 = lodepng_get_bpp(mode);
  local_109 = uVar5 == 1;
  local_104 = 2;
  if (8 < uVar5) {
    local_104 = 0x101;
  }
  if (8 >= uVar5 && !(bool)local_109) {
    if (uVar5 == 2) {
      local_104 = 4;
    }
    else {
      local_104 = 0x100;
      if (uVar5 == 4) {
        local_104 = 0x10;
      }
    }
  }
  uVar10 = (uint)((LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY);
  uVar4 = uVar4 ^ 1;
  color_tree_init(&tree);
  if (mode->bitdepth == 0x10) {
    sVar16 = 0;
    do {
      if (local_f8 == sVar16) goto LAB_0032853c;
      getPixelColorRGBA16(&r,&g,&b,&a,local_100,sVar16,mode);
    } while ((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) &&
            (((b & 0xff) == b >> 8 && (sVar16 = sVar16 + 1, (a & 0xff) == a >> 8))));
    g = 0;
    r = 0;
    b = 0;
    a = 0;
    profile->bits = 0x10;
    for (sVar16 = 0; local_f8 != sVar16; sVar16 = sVar16 + 1) {
      getPixelColorRGBA16(&r,&g,&b,&a,local_100,sVar16,mode);
      if (uVar10 == 0) {
        if (r != g) {
LAB_003283fa:
          profile->colored = 1;
          goto LAB_00328403;
        }
        uVar10 = 0;
        bVar18 = false;
        if (r != b) goto LAB_003283fa;
      }
      else {
LAB_00328403:
        bVar18 = true;
        uVar10 = 1;
      }
      if (uVar4 == 0) {
        if ((r == profile->key_r) && (g == profile->key_g)) {
          bVar17 = b == profile->key_b;
        }
        else {
          bVar17 = false;
        }
        if (a == 0xffff) {
          uVar4 = 0;
          if ((bool)(profile->key != 0 & bVar17)) goto LAB_00328497;
        }
        else {
          if ((a != 0) || (!(bool)(profile->key == 0 | bVar17))) {
LAB_00328497:
            profile->alpha = 1;
            goto LAB_0032849f;
          }
          uVar4 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = r;
            profile->key_g = g;
            profile->key_b = b;
          }
        }
      }
      else {
LAB_0032849f:
        uVar4 = 1;
        if (bVar18) break;
      }
    }
    if ((profile->key != 0) && (profile->alpha == 0)) {
      for (sVar16 = 0; local_f8 != sVar16; sVar16 = sVar16 + 1) {
        getPixelColorRGBA16(&r,&g,&b,&a,local_100,sVar16,mode);
        if ((((a != 0) && (r == profile->key_r)) && (g == profile->key_g)) && (b == profile->key_b))
        {
          profile->alpha = 1;
        }
      }
    }
  }
  else {
LAB_0032853c:
    uVar8 = 0;
    sVar16 = 0;
    g = g & 0xff00;
    r = r & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    local_d4 = uVar5;
    local_c8 = mode;
    do {
      uVar5 = local_d4;
      uVar9 = 1;
      if (local_f8 == sVar16) break;
      local_e8 = uVar8;
      local_c0 = sVar16;
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_100,sVar16,local_c8);
      uVar11 = profile->bits;
      bVar12 = (byte)r;
      if ((local_109 & 1) == 0 && uVar11 < 8) {
        uVar6 = uVar9;
        if ((1 < (byte)((byte)r + 1)) && (uVar6 = 8, (byte)r % 0x11 == 0)) {
          bVar18 = (byte)r % 0x55 != 0;
          uVar6 = bVar18 + 2 + (uint)bVar18;
        }
        if (uVar11 < uVar6) {
          profile->bits = uVar6;
          uVar11 = uVar6;
        }
      }
      local_109 = uVar5 <= uVar11;
      uVar13 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
      g_00 = (byte)g;
      bVar2 = (byte)b;
      local_cc = uVar9;
      uVar5 = uVar11;
      if (uVar10 == 0) {
        if ((byte)r == (byte)g) {
          uVar13 = 0;
          local_cc = 0;
          if ((byte)r == (byte)b) goto LAB_0032865c;
        }
        uVar14 = (undefined7)(uVar13 >> 8);
        uVar13 = CONCAT71(uVar14,1);
        profile->colored = 1;
        local_cc = 1;
        if (uVar11 < 8) {
          profile->bits = 8;
          uVar5 = 8;
          uVar13 = CONCAT71(uVar14,1);
        }
      }
LAB_0032865c:
      bVar3 = (byte)a;
      if (uVar4 == 0) {
        if ((profile->key_r == (r & 0xff)) && (profile->key_g == (g & 0xff))) {
          bVar18 = profile->key_b == (b & 0xff);
        }
        else {
          bVar18 = false;
        }
        if ((byte)a == 0xff) {
          bVar15 = 0;
          local_d0 = 0;
          if ((bool)(profile->key != 0 & bVar18)) {
            profile->alpha = 1;
            goto joined_r0x00328856;
          }
        }
        else {
          if (((byte)a != 0) || (!(bool)(profile->key == 0 | bVar18))) {
            profile->alpha = 1;
joined_r0x00328856:
            if (uVar5 < 8) {
              profile->bits = 8;
            }
            goto LAB_00328668;
          }
          bVar15 = 0;
          local_d0 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = r & 0xff;
            bVar15 = 0;
            local_d0 = 0;
            profile->key_g = g & 0xff;
            profile->key_b = b & 0xff;
          }
        }
      }
      else {
LAB_00328668:
        bVar15 = 1;
        local_d0 = uVar9;
      }
      uVar8 = 1;
      if ((uint)local_e8 == 0) {
        local_e8 = CONCAT44(local_e8._4_4_,uVar11);
        local_ec = (uint)uVar13;
        local_105 = (byte)g;
        local_106 = (byte)r;
        local_d8 = (uint)(byte)b;
        local_dc = (uint)(byte)a;
        iVar7 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(byte)a);
        uVar13 = (ulong)local_ec;
        uVar8 = 0;
        uVar11 = (uint)local_e8;
        if (iVar7 < 0) {
          local_108 = bVar3;
          local_107 = bVar2;
          color_tree_add(&tree,bVar12,g_00,(uchar)local_d8,(uchar)local_dc,profile->numcolors);
          uVar4 = profile->numcolors;
          if ((ulong)uVar4 < 0x100) {
            uVar8 = (ulong)(uVar4 * 4);
            profile->palette[(ulong)uVar4 * 4] = local_106;
            profile->palette[uVar8 + 1] = local_105;
            profile->palette[uVar8 + 2] = local_107;
            profile->palette[uVar8 + 3] = local_108;
          }
          uVar13 = (ulong)local_ec;
          profile->numcolors = uVar4 + 1;
          uVar8 = (ulong)(local_104 <= uVar4 + 1);
          uVar11 = (uint)local_e8;
        }
      }
      bVar12 = (byte)uVar13 & bVar15 & (byte)uVar8;
      in_R11 = CONCAT71((int7)(uVar13 >> 8),bVar12);
      sVar16 = local_c0 + 1;
      uVar4 = local_d0;
      uVar10 = local_cc;
    } while ((bVar12 != 1) || (uVar11 < local_d4));
    mode_00 = local_c8;
    if ((profile->key != 0) && (profile->alpha == 0)) {
      for (sVar16 = 0; local_f8 != sVar16; sVar16 = sVar16 + 1) {
        getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_100,sVar16,mode_00)
        ;
        if (((((byte)a != '\0') && (profile->key_r == (r & 0xff))) && (profile->key_g == (g & 0xff))
            ) && (profile->key_b == (b & 0xff))) {
          profile->alpha = 1;
        }
      }
    }
    uVar4._0_2_ = profile->key_r;
    uVar4._2_2_ = profile->key_g;
    auVar19._8_2_ = 0x101;
    auVar19._0_8_ = 0x101010101010101;
    auVar19._10_2_ = 0x101;
    auVar19._12_2_ = 0x101;
    auVar19._14_2_ = 0x101;
    auVar19 = vpmullw_avx(ZEXT416(uVar4),auVar19);
    profile->key_r = (short)auVar19._0_4_;
    profile->key_g = (short)((uint)auVar19._0_4_ >> 0x10);
    profile->key_b = (short)*(undefined4 *)&profile->key_b * 0x101;
  }
  color_tree_cleanup(&tree);
  return 0;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}